

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rigid-body-kinematics.hxx
# Opt level: O2

Orientation * __thiscall
stateObservation::kine::Orientation::setToProductNoAlias
          (Orientation *this,Orientation *R1,Orientation *R2)

{
  Matrix<double,_3,_3,_0,_3,_3> *pMVar1;
  Matrix<double,_3,_3,_0,_3,_3> *local_50;
  Quaternion<double,_0> local_48;
  
  check_(R1);
  check_(R2);
  if (((R1->q_).isSet_.b_ == true) && ((R2->q_).isSet_.b_ == true)) {
    if (((R1->m_).isSet_.b_ == true) && ((R2->m_).isSet_.b_ == true)) {
      CheckedItem<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false,_false,_true,_true>::chckitm_check_
                (&R1->m_);
      CheckedItem<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false,_false,_true,_true>::chckitm_check_
                (&R2->m_);
      local_48.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = (double)&(R2->m_).v_;
      (this->m_).isSet_.b_ = true;
      local_50 = &(this->m_).v_;
      local_48.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = (double)&(R1->m_).v_;
      Eigen::NoAlias<Eigen::Matrix<double,3,3,0,3,3>,Eigen::MatrixBase>::operator=
                ((NoAlias<Eigen::Matrix<double,3,3,0,3,3>,Eigen::MatrixBase> *)&local_50,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                  *)&local_48);
    }
    else {
      (this->m_).isSet_.b_ = false;
    }
    CheckedItem<Eigen::Quaternion<double,_0>,_false,_false,_true,_true>::chckitm_check_(&R1->q_);
    CheckedItem<Eigen::Quaternion<double,_0>,_false,_false,_true,_true>::chckitm_check_(&R2->q_);
    Eigen::internal::
    quat_product<1,_Eigen::Quaternion<double,_0>,_Eigen::Quaternion<double,_0>,_double>::run
              ((QuaternionBase<Eigen::Quaternion<double,_0>_> *)&(R1->q_).v_,
               (QuaternionBase<Eigen::Quaternion<double,_0>_> *)&(R2->q_).v_);
    CheckedItem<Eigen::Quaternion<double,_0>,_false,_false,_true,_true>::operator=
              (&this->q_,&local_48);
    return this;
  }
  (this->m_).isSet_.b_ = true;
  if ((R1->m_).isSet_.b_ == false) {
    pMVar1 = quaternionToMatrix_(R1);
  }
  else {
    pMVar1 = &(R1->m_).v_;
    if ((R2->m_).isSet_.b_ == false) {
      CheckedItem<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false,_false,_true,_true>::chckitm_check_
                (&R1->m_);
      local_48.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[1] = (double)quaternionToMatrix_(R2);
      local_48.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
      m_data.array[0] = (double)pMVar1;
      CheckedItem<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false,_false,_true,_true>::chckitm_check_
                (&this->m_);
      goto LAB_00179d48;
    }
    CheckedItem<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false,_false,_true,_true>::chckitm_check_
              (&R1->m_);
  }
  CheckedItem<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false,_false,_true,_true>::chckitm_check_
            (&R2->m_);
  local_48.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array[1] = (double)&(R2->m_).v_;
  local_48.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
  array[0] = (double)pMVar1;
  CheckedItem<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_false,_false,_true,_true>::chckitm_check_
            (&this->m_);
LAB_00179d48:
  local_50 = &(this->m_).v_;
  Eigen::NoAlias<Eigen::Matrix<double,3,3,0,3,3>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,3,3,0,3,3>,Eigen::MatrixBase> *)&local_50,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
              *)&local_48);
  (this->q_).isSet_.b_ = false;
  return this;
}

Assistant:

inline const Orientation & Orientation::setToProductNoAlias(const Orientation & R1, const Orientation & R2)
{
  R1.check_();
  R2.check_();
  if(R1.isQuaternionSet() && R2.isQuaternionSet())
  {
    if(R1.isMatrixSet() && R2.isMatrixSet())
    {
      m_.set().noalias() = R1.m_() * R2.m_();
    }
    else
    {
      m_.reset();
    }
    q_ = R1.q_() * R2.q_();
  }
  else
  {
    m_.set(true); /// we set the matrix as initialized before giving the value
    if(!R1.isMatrixSet())
    {
      m_().noalias() = R1.quaternionToMatrix_() * R2.m_();
    }
    else if(!R2.isMatrixSet())
    {
      m_().noalias() = R1.m_() * R2.quaternionToMatrix_();
    }
    else
    {
      m_().noalias() = R1.m_() * R2.m_();
    }
    q_.reset();
  }

  return *this;
}